

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.cpp
# Opt level: O2

void __thiscall
duckdb::ArenaAllocator::ArenaAllocator
          (ArenaAllocator *this,Allocator *allocator,idx_t initial_capacity)

{
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t iVar1;
  pointer *__ptr;
  code *pcVar2;
  _Head_base<0UL,_duckdb::ArenaChunk_*,_false> local_28;
  _Head_base<0UL,_duckdb::PrivateAllocatorData_*,_false> local_20;
  
  this->allocator = allocator;
  this->initial_capacity = initial_capacity;
  (this->head).super_unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ArenaChunk_*,_std::default_delete<duckdb::ArenaChunk>_>.
  super__Head_base<0UL,_duckdb::ArenaChunk_*,_false>._M_head_impl = (ArenaChunk *)0x0;
  make_uniq<duckdb::ArenaAllocatorData,duckdb::ArenaAllocator&>((duckdb *)&local_28,this);
  local_20._M_head_impl = (PrivateAllocatorData *)local_28._M_head_impl;
  local_28._M_head_impl = (ArenaChunk *)0x0;
  pcVar2 = ArenaAllocatorAllocate;
  Allocator::Allocator
            (&this->arena_allocator,ArenaAllocatorAllocate,ArenaAllocatorFree,
             ArenaAllocateReallocate,
             (unique_ptr<duckdb::PrivateAllocatorData,_std::default_delete<duckdb::PrivateAllocatorData>,_true>
              *)&local_20);
  iVar1 = extraout_RDX;
  if ((ArenaChunk *)local_20._M_head_impl != (ArenaChunk *)0x0) {
    (*((((AllocatedData *)&(local_20._M_head_impl)->_vptr_PrivateAllocatorData)->allocator).ptr)->
      free_function)(local_20._M_head_impl,(data_ptr_t)pcVar2,extraout_RDX);
    iVar1 = extraout_RDX_00;
  }
  local_20._M_head_impl = (PrivateAllocatorData *)0x0;
  if (local_28._M_head_impl != (ArenaChunk *)0x0) {
    (*(((local_28._M_head_impl)->data).allocator.ptr)->free_function)
              ((PrivateAllocatorData *)local_28._M_head_impl,(data_ptr_t)pcVar2,iVar1);
  }
  this->allocated_size = 0;
  local_28._M_head_impl = (ArenaChunk *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>::reset
            ((__uniq_ptr_impl<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)
             &this->head,(pointer)0x0);
  ::std::unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_>::~unique_ptr
            ((unique_ptr<duckdb::ArenaChunk,_std::default_delete<duckdb::ArenaChunk>_> *)&local_28);
  this->tail = (ArenaChunk *)0x0;
  return;
}

Assistant:

ArenaAllocator::ArenaAllocator(Allocator &allocator, idx_t initial_capacity)
    : allocator(allocator), initial_capacity(initial_capacity),
      arena_allocator(ArenaAllocatorAllocate, ArenaAllocatorFree, ArenaAllocateReallocate,
                      make_uniq<ArenaAllocatorData>(*this)) {
	head = nullptr;
	tail = nullptr;
}